

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.h
# Opt level: O1

void __thiscall
mp::
PLConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConsiderShorteningPL
          (PLConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar4;
  pointer pdVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar7 = this->i0;
  uVar9 = this->i1;
  uVar8 = uVar7;
  if (uVar7 < uVar9) {
    pdVar3 = (this->points_).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = (((this->
              super_BasicFuncConstrCvt<mp::PLConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ).
              super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             .mdl_cvt_)->
            super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ).
            super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[this->x];
    do {
      uVar8 = uVar7;
      if (dVar1 < pdVar3[uVar7 + 1]) break;
      uVar7 = uVar7 + 1;
      this->i0 = uVar7;
      uVar8 = uVar9;
    } while (uVar9 != uVar7);
  }
  uVar7 = this->i1;
  bVar10 = uVar8 < uVar7;
  if (bVar10) {
    pdVar3 = (this->points_).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = (((this->
              super_BasicFuncConstrCvt<mp::PLConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ).
              super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             .mdl_cvt_)->
            super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ).
            super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .super_FlatModel<mp::DefaultFlatModelParams>.var_ub_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[this->x];
    uVar9 = uVar7;
    if (dVar1 <= pdVar3[uVar7 - 1]) {
      do {
        uVar7 = uVar9 - 1;
        bVar10 = uVar8 < uVar7;
        if (!bVar10) {
          this->i1 = uVar7;
          return;
        }
        lVar6 = uVar9 - 2;
        uVar9 = uVar7;
      } while (dVar1 <= pdVar3[lVar6]);
      this->i1 = uVar7;
    }
    if (bVar10) {
      pFVar4 = (this->
               super_BasicFuncConstrCvt<mp::PLConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
      pdVar3 = (this->points_).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = this->x;
      dVar1 = (pFVar4->
              super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ).
              super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar2];
      if (pdVar3[uVar8] < dVar1) {
        pdVar5 = (this->points_).y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5[uVar8] =
             pdVar5[uVar8 + 1] -
             (pdVar3[uVar8 + 1] - dVar1) *
             ((pdVar5[uVar8 + 1] - pdVar5[uVar8]) / (pdVar3[uVar8 + 1] - pdVar3[uVar8]));
        pdVar3[uVar8] = dVar1;
      }
      dVar1 = (pFVar4->
              super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ).
              super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .super_FlatModel<mp::DefaultFlatModelParams>.var_ub_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar2];
      if (dVar1 < pdVar3[uVar7]) {
        pdVar5 = (this->points_).y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5[uVar7] =
             pdVar5[uVar7 - 1] -
             (pdVar3[uVar7 - 1] - dVar1) *
             ((pdVar5[uVar7 - 1] - pdVar5[uVar7]) / (pdVar3[uVar7 - 1] - pdVar3[uVar7]));
        pdVar3[uVar7] = dVar1;
      }
    }
  }
  return;
}

Assistant:

void ConsiderShorteningPL() {
    while (i0<i1 && GetMC().lb(x)>=points_.x_[i0+1])
      ++i0;
    while (i0<i1 && GetMC().ub(x)<=points_.x_[i1-1])
      --i1;
    if (i1>i0) {             // don't need otherwise
      if (GetMC().lb(x) > points_.x_[i0])
        ExtendSegTo(i0, i0+1, GetMC().lb(x));
      if (GetMC().ub(x) < points_.x_[i1])
        ExtendSegTo(i1, i1-1, GetMC().ub(x));
    }
  }